

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O2

void regen_measure_index(vmd_file_t *file)

{
  vmd_time_t vVar1;
  uint uVar2;
  uint time;
  vmd_bst_node_t *node;
  int iVar3;
  int value;
  vmd_bst_node_t *i;
  uint uVar4;
  bool bVar5;
  
  vmd_bst_clear(&(file->measure_index).bst);
  uVar2 = file->ctrl[0x58].default_value;
  time = 0;
  node = vmd_bst_node_child_most((vmd_bst_node_t *)(file->ctrl + 0x58),0);
  value = 1;
  for (; node != (vmd_bst_node_t *)(file->ctrl + 0x58); node = vmd_bst_node_adj(node,1)) {
    bVar5 = node == (vmd_bst_node_t *)0x0;
    while (!bVar5) {
      vVar1 = vmd_map_time(node);
      iVar3 = (uVar2 & 0xff) * ((file->division << 2) >> ((byte)(uVar2 >> 8) & 0x1f));
      uVar4 = ~time;
      uVar2 = vmd_map_value(node);
      time = vmd_map_time(node);
      value = value + (int)(vVar1 + uVar4 + iVar3) / iVar3;
      vmd_map_set(&file->measure_index,time,value);
      bVar5 = true;
    }
  }
  return;
}

Assistant:

static void
regen_measure_index(file_t *file)
{
	bst_clear(&file->measure_index.bst);
	map_t *ts_map = &file->ctrl[FCTRL_TIMESIG];
	int ts = ts_map->default_value;
	time_t time = 0;
	int measure = 1;
	BST_FOREACH (bst_node_t *i, &ts_map->bst) {
		int dm = measures(file, map_time(i) - time, ts);
		ts = map_value(i);
		time = map_time(i);
		measure += dm;
		map_set(&file->measure_index, time, measure);
	}
}